

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O3

Matrix3d * Util::OrthoNormMat(Matrix3d *mat)

{
  double *pdVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  Matrix3d *out;
  uint uVar7;
  ulong uVar8;
  Scalar *dst_ptr_1;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 local_58 [16];
  double local_48;
  undefined1 local_38 [16];
  double local_28;
  undefined1 local_18 [16];
  double local_8;
  
  dVar10 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
  dVar14 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[1];
  dVar13 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[2];
  dVar4 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar5 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  dVar3 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5];
  dVar15 = (dVar13 * dVar3 + dVar14 * dVar5 + dVar10 * dVar4) * 0.5;
  auVar17._0_8_ = dVar10 - dVar4 * dVar15;
  auVar17._8_8_ = dVar14 - dVar5 * dVar15;
  auVar11._0_8_ =
       dVar4 - (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6] * dVar15;
  auVar11._8_8_ =
       dVar5 - (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] * dVar15;
  dVar14 = auVar11._8_8_ * auVar17._0_8_ - auVar17._8_8_ * auVar11._0_8_;
  dVar10 = dVar3 - (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] * dVar15;
  dVar13 = dVar13 - dVar3 * dVar15;
  auVar9._0_8_ = auVar17._8_8_ * dVar10 - auVar11._8_8_ * dVar13;
  auVar9._8_8_ = auVar11._0_8_ * dVar13 - dVar10 * auVar17._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar13 * dVar13 + auVar17._8_8_ * auVar17._8_8_ + auVar17._0_8_ * auVar17._0_8_;
  auVar20 = sqrtpd(auVar19,auVar19);
  auVar21._0_8_ = auVar20._0_8_;
  auVar21._8_8_ = auVar21._0_8_;
  local_18 = divpd(auVar17,auVar21);
  local_8 = dVar13 / auVar21._0_8_;
  auVar16._0_8_ = dVar10 * dVar10 + auVar11._8_8_ * auVar11._8_8_ + auVar11._0_8_ * auVar11._0_8_;
  auVar16._8_8_ = 0;
  auVar17 = sqrtpd(auVar16,auVar16);
  auVar18._0_8_ = auVar17._0_8_;
  auVar18._8_8_ = auVar18._0_8_;
  local_38 = divpd(auVar11,auVar18);
  local_28 = dVar10 / auVar18._0_8_;
  auVar20._0_8_ = dVar14 * dVar14 + auVar9._8_8_ * auVar9._8_8_ + auVar9._0_8_ * auVar9._0_8_;
  auVar20._8_8_ = 0;
  auVar11 = sqrtpd(auVar20,auVar20);
  auVar12._0_8_ = auVar11._0_8_;
  auVar12._8_8_ = auVar12._0_8_;
  local_58 = divpd(auVar9,auVar12);
  local_48 = dVar14 / auVar12._0_8_;
  uVar7 = (uint)((ulong)out >> 3) & 1;
  if (((ulong)out >> 3 & 1) == 0) {
    uVar8 = (ulong)(uVar7 << 3);
    uVar6 = *(undefined8 *)(local_18 + uVar8 + 8);
    puVar2 = (undefined8 *)
             ((long)(out->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array + uVar8);
    *puVar2 = *(undefined8 *)(local_18 + uVar8);
    puVar2[1] = uVar6;
    (out->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
         dVar13 / auVar21._0_8_;
  }
  else {
    (out->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
         local_18._0_8_;
    uVar8 = (ulong)(uVar7 << 3);
    uVar6 = *(undefined8 *)(local_18 + uVar8 + 8);
    puVar2 = (undefined8 *)
             ((long)(out->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array + uVar8);
    *puVar2 = *(undefined8 *)(local_18 + uVar8);
    puVar2[1] = uVar6;
  }
  pdVar1 = (out->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array + 3;
  uVar7 = (uint)((ulong)pdVar1 >> 3) & 1;
  if (((ulong)pdVar1 >> 3 & 1) == 0) {
    uVar8 = (ulong)(uVar7 << 3);
    uVar6 = *(undefined8 *)(local_38 + uVar8 + 8);
    puVar2 = (undefined8 *)
             ((long)(out->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array + uVar8 + 0x18);
    *puVar2 = *(undefined8 *)(local_38 + uVar8);
    puVar2[1] = uVar6;
    (out->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
         dVar10 / auVar18._0_8_;
  }
  else {
    *pdVar1 = local_38._0_8_;
    uVar8 = (ulong)(uVar7 << 3);
    uVar6 = *(undefined8 *)(local_38 + uVar8 + 8);
    *(undefined8 *)((long)pdVar1 + uVar8) = *(undefined8 *)(local_38 + uVar8);
    ((undefined8 *)((long)pdVar1 + uVar8))[1] = uVar6;
  }
  pdVar1 = (out->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array + 6;
  uVar7 = (uint)((ulong)pdVar1 >> 3) & 1;
  if (((ulong)pdVar1 >> 3 & 1) == 0) {
    uVar8 = (ulong)(uVar7 << 3);
    uVar6 = *(undefined8 *)(local_58 + uVar8 + 8);
    puVar2 = (undefined8 *)
             ((long)(out->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array + uVar8 + 0x30);
    *puVar2 = *(undefined8 *)(local_58 + uVar8);
    puVar2[1] = uVar6;
    (out->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
         dVar14 / auVar12._0_8_;
    return out;
  }
  *pdVar1 = local_58._0_8_;
  uVar8 = (ulong)(uVar7 << 3);
  uVar6 = *(undefined8 *)(local_58 + uVar8 + 8);
  *(undefined8 *)((long)pdVar1 + uVar8) = *(undefined8 *)(local_58 + uVar8);
  ((undefined8 *)((long)pdVar1 + uVar8))[1] = uVar6;
  return out;
}

Assistant:

Eigen::Matrix3d OrthoNormMat(Eigen::Matrix3d mat){

		//extract columns
		Eigen::Vector3d x = mat.block(0,0,3,1);
		Eigen::Vector3d y = mat.block(0,1,3,1);
		Eigen::Vector3d z = mat.block(0,2,3,1);

		//error
		double err = x.dot(y);

		//orthogonal vectors
		Eigen::Vector3d x_ort = x - 0.5*err*y;
		Eigen::Vector3d y_ort = y - 0.5*err*z;
		Eigen::Vector3d z_ort = x_ort.cross(y_ort);

		//normalize
		x_ort = x_ort/x_ort.norm();
		y_ort = y_ort/y_ort.norm();
		z_ort = z_ort/z_ort.norm();

		//output
		Eigen::Matrix3d out;
		out.block(0,0,3,1) = x_ort;
		out.block(0,1,3,1) = y_ort;
		out.block(0,2,3,1) = z_ort;

		return out;
		// return mat;


	}